

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  UpVal *pUVar1;
  UpVal *pUVar2;
  anon_union_16_2_5131162a_for_u *paVar3;
  
  paVar3 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  while ((pUVar1 = (paVar3->open).next, pUVar1 != (UpVal *)0x0 && (level <= (StkId)(pUVar1->v).p)))
  {
    if ((StkId)(pUVar1->v).p == level) {
      return pUVar1;
    }
    paVar3 = &pUVar1->u;
  }
  pUVar2 = (UpVal *)luaC_newobj(L,'\t',0x28);
  pUVar1 = (paVar3->open).next;
  (pUVar2->v).p = (TValue *)level;
  (pUVar2->u).open.next = pUVar1;
  *(anon_union_16_2_5131162a_for_u **)((long)&pUVar2->u + 8) = paVar3;
  if (pUVar1 != (UpVal *)0x0) {
    (pUVar1->u).open.previous = (UpVal **)&pUVar2->u;
  }
  (paVar3->open).next = pUVar2;
  if (L->twups == L) {
    L->twups = L->l_G->twups;
    L->l_G->twups = L;
  }
  return pUVar2;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  UpVal **pp = &L->openupval;
  UpVal *p;
  lua_assert(isintwups(L) || L->openupval == NULL);
  while ((p = *pp) != NULL && uplevel(p) >= level) {  /* search for it */
    lua_assert(!isdead(G(L), p));
    if (uplevel(p) == level)  /* corresponding upvalue? */
      return p;  /* return it */
    pp = &p->u.open.next;
  }
  /* not found: create a new upvalue after 'pp' */
  return newupval(L, level, pp);
}